

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::LazilyBuildDependenciesTest_Message_Test::TestBody
          (LazilyBuildDependenciesTest_Message_Test *this)

{
  bool bVar1;
  internal iVar2;
  FileDescriptor *this_00;
  Descriptor *pDVar3;
  DescriptorPool *this_01;
  char *pcVar4;
  char *in_R9;
  string_view proto;
  string_view file_name;
  string_view filename;
  string_view filename_00;
  string_view name;
  string_view filename_01;
  string_view filename_02;
  string_view name_00;
  string_view name_01;
  string_view lowercase_name;
  string_view camelcase_name;
  string_view filename_03;
  string_view filename_04;
  string_view message_name;
  FieldDescriptor *field;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  AssertHelper local_20;
  
  proto._M_str = 
  "\n    name: \'foo.proto\'\n    package: \'proto2_unittest\'\n    dependency: \'bar.proto\'\n    message_type {\n      name: \'Foo\'\n      field {\n        name: \'bar\'\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_MESSAGE\n        type_name: \'.proto2_unittest.Bar\'\n      }\n    }"
  ;
  proto._M_len = 0x11b;
  LazilyBuildDependenciesTest::ParseProtoAndAddToDb(&this->super_LazilyBuildDependenciesTest,proto);
  file_name._M_str = "bar";
  file_name._M_len = 3;
  message_name._M_str = "Bar";
  message_name._M_len = 3;
  LazilyBuildDependenciesTest::AddSimpleMessageProtoFileToDb
            (&this->super_LazilyBuildDependenciesTest,file_name,message_name);
  this_01 = &(this->super_LazilyBuildDependenciesTest).pool_;
  filename._M_str = "foo.proto";
  filename._M_len = 9;
  bVar1 = DescriptorPool::InternalIsFileLoaded(this_01,filename);
  iVar2 = (internal)!bVar1;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58._M_head_impl._0_1_ = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"foo.proto\")","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3994,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  filename_00._M_str = "bar.proto";
  filename_00._M_len = 9;
  bVar1 = DescriptorPool::InternalIsFileLoaded(this_01,filename_00);
  local_58._M_head_impl._0_1_ = (internal)!bVar1;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3995,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  name._M_str = "foo.proto";
  name._M_len = 9;
  this_00 = DescriptorPool::FindFileByName(this_01,name);
  local_58._M_head_impl._0_1_ = (internal)(this_00 != (FileDescriptor *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,(AssertionResult *)0x10b0e05,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x399a,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  filename_01._M_str = "foo.proto";
  filename_01._M_len = 9;
  local_58._M_head_impl._0_1_ = (internal)DescriptorPool::InternalIsFileLoaded(this_01,filename_01);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"foo.proto\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x399b,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  filename_02._M_str = "bar.proto";
  filename_02._M_len = 9;
  bVar1 = DescriptorPool::InternalIsFileLoaded(this_01,filename_02);
  local_58._M_head_impl._0_1_ = (internal)!bVar1;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x399c,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  name_00._M_str = "Foo";
  name_00._M_len = 3;
  pDVar3 = FileDescriptor::FindMessageTypeByName(this_00,name_00);
  name_01._M_str = "bar";
  name_01._M_len = 3;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByName(pDVar3,name_01);
  local_58._M_head_impl._0_1_ =
       (internal)((FieldDescriptor *)local_48._M_head_impl != (FieldDescriptor *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((FieldDescriptor *)local_48._M_head_impl == (FieldDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,(AssertionResult *)0x11835db,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a3,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_60.data_ + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByNumber(pDVar3,1);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"field","desc->FindFieldByNumber(1)",(FieldDescriptor **)&local_48
             ,(FieldDescriptor **)&local_58);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((FieldDescriptor *)local_58._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  lowercase_name._M_str = "bar";
  lowercase_name._M_len = 3;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByLowercaseName(pDVar3,lowercase_name);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"field","desc->FindFieldByLowercaseName(\"bar\")",
             (FieldDescriptor **)&local_48,(FieldDescriptor **)&local_58);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((FieldDescriptor *)local_58._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  camelcase_name._M_str = "bar";
  camelcase_name._M_len = 3;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByCamelcaseName(pDVar3,camelcase_name);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"field","desc->FindFieldByCamelcaseName(\"bar\")",
             (FieldDescriptor **)&local_48,(FieldDescriptor **)&local_58);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((FieldDescriptor *)local_58._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  filename_03._M_str = "bar.proto";
  filename_03._M_len = 9;
  bVar1 = DescriptorPool::InternalIsFileLoaded(this_01,filename_03);
  iVar2 = (internal)!bVar1;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58._M_head_impl._0_1_ = iVar2;
  if (!(bool)iVar2) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39a7,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_60.data_ + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)local_48._M_head_impl);
  local_58._M_head_impl._0_1_ = (internal)(pDVar3 != (Descriptor *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,
               (AssertionResult *)"field->message_type() != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39ab,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_60.data_ + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  filename_04._M_str = "bar.proto";
  filename_04._M_len = 9;
  local_58._M_head_impl._0_1_ = (internal)DescriptorPool::InternalIsFileLoaded(this_01,filename_04);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_58,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x39ac,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_60.data_ + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  return;
}

Assistant:

TEST_F(LazilyBuildDependenciesTest, Message) {
  ParseProtoAndAddToDb(R"pb(
    name: 'foo.proto'
    package: 'proto2_unittest'
    dependency: 'bar.proto'
    message_type {
      name: 'Foo'
      field {
        name: 'bar'
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_MESSAGE
        type_name: '.proto2_unittest.Bar'
      }
    })pb");
  AddSimpleMessageProtoFileToDb("bar", "Bar");

  // Verify neither has been built yet.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  const FileDescriptor* file = pool_.FindFileByName("foo.proto");

  // Verify only foo gets built when asking for foo.proto
  EXPECT_TRUE(file != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  // Verify calling FindFieldBy* works when the type of the field was
  // not built at cross link time. Verify this doesn't build the file
  // the field's type is defined in, as well.
  const Descriptor* desc = file->FindMessageTypeByName("Foo");
  const FieldDescriptor* field = desc->FindFieldByName("bar");
  EXPECT_TRUE(field != nullptr);
  EXPECT_EQ(field, desc->FindFieldByNumber(1));
  EXPECT_EQ(field, desc->FindFieldByLowercaseName("bar"));
  EXPECT_EQ(field, desc->FindFieldByCamelcaseName("bar"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  // Finally, verify that if we call message_type() on the field, we will
  // build the file where the message is defined, and get a valid descriptor
  EXPECT_TRUE(field->message_type() != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("bar.proto"));
}